

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

bool __thiscall WorkQueue<HTTPClosure>::Enqueue(WorkQueue<HTTPClosure> *this,HTTPClosure *item)

{
  long lVar1;
  size_type sVar2;
  bool bVar3;
  long in_FS_OFFSET;
  _Head_base<0UL,_HTTPClosure_*,_false> local_40;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = false;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock7,&this->cs,"cs",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
             ,0x5f,false);
  if (this->running == true) {
    sVar2 = std::
            deque<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
            ::size(&this->queue);
    if (sVar2 < this->maxDepth) {
      local_40._M_head_impl = item;
      std::
      deque<std::unique_ptr<HTTPClosure,std::default_delete<HTTPClosure>>,std::allocator<std::unique_ptr<HTTPClosure,std::default_delete<HTTPClosure>>>>
      ::emplace_back<std::unique_ptr<HTTPClosure,std::default_delete<HTTPClosure>>>
                ((deque<std::unique_ptr<HTTPClosure,std::default_delete<HTTPClosure>>,std::allocator<std::unique_ptr<HTTPClosure,std::default_delete<HTTPClosure>>>>
                  *)&this->queue,
                 (unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_> *)&local_40);
      if (local_40._M_head_impl != (HTTPClosure *)0x0) {
        (*(local_40._M_head_impl)->_vptr_HTTPClosure[2])();
      }
      std::condition_variable::notify_one();
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!cs)
    {
        LOCK(cs);
        if (!running || queue.size() >= maxDepth) {
            return false;
        }
        queue.emplace_back(std::unique_ptr<WorkItem>(item));
        cond.notify_one();
        return true;
    }